

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

iterator * __thiscall
idx2::IncreaseCapacity<short,idx2::bitstream>
          (iterator *__return_storage_ptr__,idx2 *this,hash_table<short,_idx2::bitstream> *Ht,
          iterator *ItIn)

{
  char *pcVar1;
  bitstream *pbVar2;
  i64 iVar3;
  iterator iVar4;
  long lVar5;
  short *Key;
  hash_table<short,_idx2::bitstream> *phVar6;
  long lVar7;
  long lVar8;
  bitstream *in_R8;
  iterator Result;
  hash_table<short,_idx2::bitstream> NewHt;
  undefined1 local_88 [32];
  hash_table<short,_idx2::bitstream> local_68;
  
  pbVar2 = Ht->Vals;
  phVar6 = (hash_table<short,_idx2::bitstream> *)Ht->Stats;
  iVar3 = Ht->Size;
  __return_storage_ptr__->Key = Ht->Keys;
  __return_storage_ptr__->Val = pbVar2;
  __return_storage_ptr__->Ht = phVar6;
  __return_storage_ptr__->Idx = iVar3;
  local_68.Keys = (short *)0x0;
  local_68.LogCapacity = 0;
  local_68.Alloc = (allocator *)0x0;
  local_68.Vals = SUB328(ZEXT832(0),4);
  local_68.Stats = (bucket_status *)local_68.LogCapacity;
  local_68.Size = (i64)local_68.Alloc;
  Init<short,idx2::bitstream>(&local_68,*(long *)(this + 0x20) + 1,*(allocator **)(this + 0x28));
  lVar5 = 1L << ((byte)*(long *)(this + 0x20) & 0x3f);
  if (*(long *)(this + 0x20) == 0x3f) {
    lVar7 = -0x8000000000000000;
LAB_00181160:
    if (lVar7 != lVar5) {
      Key = (short *)(lVar7 * 0x30 + *(long *)(this + 8));
      phVar6 = (hash_table<short,_idx2::bitstream> *)(lVar7 * 2 + *(long *)this);
      do {
        Insert<short,idx2::bitstream>((iterator *)local_88,(idx2 *)&local_68,phVar6,Key,in_R8);
        if (*Ht->Keys == *(short *)local_88._0_8_) {
          iVar4.Val = (bitstream *)local_88._8_8_;
          iVar4.Ht = (hash_table<short,_idx2::bitstream> *)local_88._16_8_;
          iVar4.Idx = local_88._24_8_;
          iVar4.Key = (short *)local_88._0_8_;
          *__return_storage_ptr__ = iVar4;
        }
        lVar5 = lVar7 * -0x30;
        lVar8 = lVar7 * -2;
        do {
          lVar5 = lVar5 + -0x30;
          lVar8 = lVar8 + -2;
          pcVar1 = (char *)(*(long *)(this + 0x10) + 1 + lVar7);
          lVar7 = lVar7 + 1;
        } while (*pcVar1 != '\x02');
        phVar6 = (hash_table<short,_idx2::bitstream> *)(*(long *)this - lVar8);
        Key = (short *)(*(long *)(this + 8) - lVar5);
      } while (1L << ((byte)this[0x20] & 0x3f) != lVar7);
    }
  }
  else {
    lVar7 = 0;
    lVar8 = 0;
    if (0 < lVar5) {
      lVar8 = lVar5;
    }
    do {
      if (*(char *)(*(long *)(this + 0x10) + lVar7) == '\x02') goto LAB_00181160;
      lVar7 = lVar7 + 1;
    } while (lVar8 + 1 != lVar7);
  }
  Dealloc<short,idx2::bitstream>((hash_table<short,_idx2::bitstream> *)this);
  *(bucket_status **)(this + 0x10) = local_68.Stats;
  *(i64 *)(this + 0x18) = local_68.Size;
  *(i64 *)(this + 0x20) = local_68.LogCapacity;
  *(allocator **)(this + 0x28) = local_68.Alloc;
  *(short **)this = local_68.Keys;
  *(bitstream **)(this + 8) = local_68.Vals;
  *(bucket_status **)(this + 0x10) = local_68.Stats;
  *(i64 *)(this + 0x18) = local_68.Size;
  __return_storage_ptr__->Ht = (hash_table<short,_idx2::bitstream> *)this;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
IncreaseCapacity(hash_table<k, v>* Ht, const typename hash_table<k, v>::iterator& ItIn)
{
  auto ItOut = ItIn;
  hash_table<k, v> NewHt;
  Init(&NewHt, Ht->LogCapacity + 1, Ht->Alloc);
  for (auto It = Begin(*Ht); It != End(*Ht); ++It)
  {
    auto Result = Insert(&NewHt, *(It.Key), *(It.Val));
    if (*(ItIn.Key) == *(Result.Key))
      ItOut = Result;
  }
  Dealloc(Ht);
  *Ht = NewHt;
  ItOut.Ht = Ht;
  return ItOut;
}